

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_141fe3::BuildSystemFrontendImpl::resetAfterBuild(BuildSystemFrontendImpl *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  BuildSystemFrontendImpl *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->stateMutex);
  this->cancelled = false;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void resetAfterBuild() {
    std::lock_guard<std::mutex> lock(stateMutex);
    cancelled = false;
  }